

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O3

void easm_print_expr(FILE *out,envy_colors *cols,easm_expr *expr,int lvl)

{
  easm_expr_type eVar1;
  int lvl_00;
  char *__format;
  char *pcVar2;
  
LAB_0026b981:
  if (lvl < 0) {
    eVar1 = expr->type;
    if (eVar1 != EASM_EXPR_VEC) goto LAB_0026b9ae;
    lvl = 0;
    lvl_00 = -1;
    pcVar2 = "%s:%s";
  }
  else {
    if (lvl == 0) {
      eVar1 = expr->type;
LAB_0026b9ae:
      if (eVar1 != EASM_EXPR_LOR) goto LAB_0026b9c3;
      lvl = 1;
      lvl_00 = 0;
      pcVar2 = "%s||%s";
      goto LAB_0026ba35;
    }
    if (lvl == 1) {
      eVar1 = expr->type;
LAB_0026b9c3:
      if (eVar1 != EASM_EXPR_LAND) goto LAB_0026b9df;
      lvl = 2;
      lvl_00 = 1;
      pcVar2 = "%s&&%s";
      goto LAB_0026ba35;
    }
    if ((uint)lvl < 3) {
      eVar1 = expr->type;
LAB_0026b9df:
      if (eVar1 != EASM_EXPR_OR) goto LAB_0026b9ff;
      lvl = 3;
      lvl_00 = 2;
      pcVar2 = "%s|%s";
      goto LAB_0026ba35;
    }
    if (lvl == 3) {
      eVar1 = expr->type;
LAB_0026b9ff:
      if (eVar1 == EASM_EXPR_XOR) {
        lvl = 4;
        lvl_00 = 3;
        pcVar2 = "%s^%s";
        goto LAB_0026ba35;
      }
    }
    else {
      if (4 < (uint)lvl) {
        if (lvl != 5) goto LAB_0026bad8;
        eVar1 = expr->type;
LAB_0026ba69:
        if (eVar1 == EASM_EXPR_SHR) {
          easm_print_expr(out,cols,expr->e1,5);
          pcVar2 = cols->sym;
          __format = "%s>>%s";
        }
        else {
          if (eVar1 != EASM_EXPR_SHL) goto LAB_0026bad8;
          easm_print_expr(out,cols,expr->e1,5);
          pcVar2 = cols->sym;
          __format = "%s<<%s";
        }
        fprintf((FILE *)out,__format,pcVar2);
        expr = expr->e2;
LAB_0026bad8:
        easm_print_sexpr(out,cols,expr,0);
        return;
      }
      eVar1 = expr->type;
    }
    if (eVar1 != EASM_EXPR_AND) goto LAB_0026ba69;
    lvl = 5;
    lvl_00 = 4;
    pcVar2 = "%s&%s";
  }
LAB_0026ba35:
  easm_print_expr(out,cols,expr->e1,lvl_00);
  fprintf((FILE *)out,pcVar2,cols->sym);
  expr = expr->e2;
  goto LAB_0026b981;
}

Assistant:

void easm_print_expr(FILE *out, const struct envy_colors *cols, struct easm_expr *expr, int lvl) {
	if (lvl <= -1 && expr->type == EASM_EXPR_VEC) {
		easm_print_expr(out, cols, expr->e1, -1);
		fprintf(out, "%s:%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 0);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_LOR) {
		easm_print_expr(out, cols, expr->e1, 0);
		fprintf(out, "%s||%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 1);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_LAND) {
		easm_print_expr(out, cols, expr->e1, 1);
		fprintf(out, "%s&&%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_OR) {
		easm_print_expr(out, cols, expr->e1, 2);
		fprintf(out, "%s|%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 3);
	} else if (lvl <= 3 && expr->type == EASM_EXPR_XOR) {
		easm_print_expr(out, cols, expr->e1, 3);
		fprintf(out, "%s^%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 4);
	} else if (lvl <= 4 && expr->type == EASM_EXPR_AND) {
		easm_print_expr(out, cols, expr->e1, 4);
		fprintf(out, "%s&%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 5);
	} else if (lvl <= 5 && expr->type == EASM_EXPR_SHL) {
		easm_print_expr(out, cols, expr->e1, 5);
		fprintf(out, "%s<<%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 6);
	} else if (lvl <= 5 && expr->type == EASM_EXPR_SHR) {
		easm_print_expr(out, cols, expr->e1, 5);
		fprintf(out, "%s>>%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 6);
	} else {
		easm_print_sexpr(out, cols, expr, 0);
	}
}